

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O2

dlist_t * dlist_getl(dlist_head_t *head,dlist_t *dlist)

{
  dlist_t *pdVar1;
  dlist_s *pdVar2;
  dlist_t *pdVar3;
  
  pdVar1 = head->dlist;
  if (pdVar1 == (dlist_t *)0x0 || dlist == (dlist_t *)0x0) {
    return (dlist_t *)0x0;
  }
  if (pdVar1 == dlist) {
    pdVar2 = dlist->next;
    head->dlist = pdVar2;
    if (pdVar2 != (dlist_s *)0x0) {
      pdVar2->prev = (dlist_s *)0x0;
    }
    if (head->end != dlist) {
      if (pdVar1 == dlist) goto LAB_0010467f;
      goto LAB_0010463e;
    }
  }
  else if (head->end != dlist) {
LAB_0010463e:
    do {
      pdVar3 = pdVar1;
      pdVar1 = pdVar3->next;
      if (pdVar1 == (dlist_s *)0x0) break;
    } while (pdVar1 != dlist);
    if (pdVar1 == (dlist_s *)0x0) {
      return (dlist_t *)0x0;
    }
    pdVar2 = dlist->next;
    pdVar3->next = pdVar2;
    if (pdVar2 != (dlist_s *)0x0) {
      pdVar2->prev = pdVar3;
    }
    goto LAB_0010467f;
  }
  pdVar2 = dlist->prev;
  head->end = pdVar2;
  if (pdVar2 != (dlist_s *)0x0) {
    pdVar2->next = (dlist_s *)0x0;
  }
LAB_0010467f:
  head->num = head->num - 1;
  dlist->next = (dlist_s *)0x0;
  dlist->prev = (dlist_s *)0x0;
  return dlist;
}

Assistant:

dlist_t *dlist_getl(dlist_head_t *head, dlist_t *dlist) {
   dlist_t *tmp = head->dlist;
   int     found = 0;

   if (!head || !dlist || !tmp)
      return NULL;

   if (head->dlist == dlist) {
      head->dlist = dlist->next;
      if (head->dlist)
         head->dlist->prev = NULL;

      found = 1;
   }

   if (head->end == dlist) {
      head->end = dlist->prev;
      if (head->end)
         head->end->next = NULL;

      found = 1;
   }

   if (!found) {
      while (tmp->next && (tmp->next != dlist)) {
         tmp = tmp->next;
      }
      
      if (!tmp->next) {
         return NULL;
      } else {
         if ((tmp->next = dlist->next)) {
            tmp->next->prev = tmp;
         }
      }
   }

   head->num--;
   dlist->prev = dlist->next = NULL;
   return dlist;
}